

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O1

void begin_generating_code(void)

{
  FILE *__stream;
  size_t __n;
  char buf [1024];
  undefined1 auStack_418 [1024];
  
  memset(map_index,0,0x20000);
  memset(synthetic_opcode_taken,0xfe,0x10000);
  memset(opcode_map_info,0,0x100000);
  memset(map_info_opcode_name,0,0x80000);
  opcode_map_info[0]._0_4_ = 0x31f800;
  map_info_opcode_name[0] = "(reserved)";
  memset(synthetic_opcode_taken,0xff,0xb5);
  num_map_infos = 1;
  parity = 1;
  if (preprocess_only == FALSE) {
    __stream = fopen("syn68k_header.h","r");
    if (__stream == (FILE *)0x0) {
      fatal_error("Unable to open syn68k_header.h for reading!\n");
    }
    __n = fread(auStack_418,1,0x400,__stream);
    while (__n != 0) {
      fwrite(auStack_418,1,__n,(FILE *)syn68k_c_stream);
      __n = fread(auStack_418,1,0x400,__stream);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void
begin_generating_code ()
{
  int i;

  /* Clear mapping table to NO_MAP. */
  for (i = 0; i < 65536; i++)
    map_index[i] = NO_MAP;

  for (i = 0; i < 65536; i++)
    synthetic_opcode_taken[i] = OPCODE_NOT_TAKEN;

  /* Zero the other arrays. */
  memset (opcode_map_info,        0, sizeof opcode_map_info);
  memset (map_info_opcode_name,   0, sizeof map_info_opcode_name);

  /* Set up default "no mapping" map; maps to opcode 0. */
  opcode_map_info[NO_MAP].cc_needed          = M68K_CC_ALL;
  opcode_map_info[NO_MAP].sequence_parity    = 0;
  opcode_map_info[NO_MAP].instruction_words  = 1;
  opcode_map_info[NO_MAP].ends_block         = TRUE;
  opcode_map_info[NO_MAP].next_block_dynamic = TRUE;
  map_info_opcode_name[0] = "(reserved)";

  /* Opcodes 0 through 0xB4 are reserved. */
  for (i = 0; i <= 0xB4; i++)
    synthetic_opcode_taken[i] = OPCODE_TAKEN;

  /* We've used one opcode map, and should now be on odd parity for the
   * next block of opcode maps.
   */
  num_map_infos = 1;
  parity = 1;

  if (!preprocess_only)
    {
      FILE *fp = fopen ("syn68k_header.h", "r");
      char buf[1024];
      size_t size;

      if (fp == NULL)
        fatal_error ("Unable to open syn68k_header.h for reading!\n");

      /* Copy the C preamble out to syn68k.c. */
      while ((size = fread (buf, 1, 1024, fp)) != 0)
	fwrite (buf, 1, size, syn68k_c_stream);

      fclose (fp);
    }
}